

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

int64_t __thiscall fasttext::Vector::argmax(Vector *this)

{
  reference pvVar1;
  int64_t iVar2;
  vector<float,_std::allocator<float>_> *in_RDI;
  int64_t i;
  int64_t argmax;
  real max;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_c;
  
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,0);
  local_c = *pvVar1;
  local_18 = 0;
  local_20 = 1;
  while( true ) {
    iVar2 = size((Vector *)0x19da3c);
    if (iVar2 <= (long)local_20) break;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,local_20);
    if (local_c < *pvVar1) {
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,local_20);
      local_c = *pvVar1;
      local_18 = local_20;
    }
    local_20 = local_20 + 1;
  }
  return local_18;
}

Assistant:

int64_t Vector::argmax() {
  real max = data_[0];
  int64_t argmax = 0;
  for (int64_t i = 1; i < size(); i++) {
    if (data_[i] > max) {
      max = data_[i];
      argmax = i;
    }
  }
  return argmax;
}